

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.H
# Opt level: O0

void amrex::BroadcastArray<char>
               (Vector<char,_std::allocator<char>_> *aT,int myLocalId,int rootId,MPI_Comm *localComm
               )

{
  Long LVar1;
  char *pcVar2;
  size_t sVar3;
  MPI_Comm *in_RCX;
  int in_EDX;
  int in_ESI;
  size_type in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  int aT_Size;
  int local_1c;
  MPI_Comm *local_18;
  int local_10;
  int local_c;
  
  local_1c = -2;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (in_ESI == in_EDX) {
    LVar1 = Vector<char,_std::allocator<char>_>::size
                      ((Vector<char,_std::allocator<char>_> *)0x11ea362);
    local_1c = (int)LVar1;
  }
  ParallelDescriptor::Bcast<int>(&local_1c,1,local_10,local_18);
  if (local_c != local_10) {
    std::vector<char,_std::allocator<char>_>::resize(unaff_retaddr,in_RDI);
  }
  if (0 < local_1c) {
    pcVar2 = Vector<char,_std::allocator<char>_>::dataPtr
                       ((Vector<char,_std::allocator<char>_> *)0x11ea3a8);
    sVar3 = Vector<char,_std::allocator<char>_>::size
                      ((Vector<char,_std::allocator<char>_> *)0x11ea3b6);
    ParallelDescriptor::Bcast<char>(pcVar2,sVar3,local_10,local_18);
  }
  return;
}

Assistant:

void amrex::BroadcastArray(Vector<T> &aT, int myLocalId, int rootId, const MPI_Comm &localComm)
{
  int aT_Size(-2);
  if(myLocalId == rootId) {
    aT_Size = aT.size();
  }
  ParallelDescriptor::Bcast(&aT_Size, 1, rootId, localComm);
  BL_ASSERT(aT_Size >= 0);
  if(myLocalId != rootId) {
    aT.resize(aT_Size);
  }
  if(aT_Size > 0) {
    ParallelDescriptor::Bcast(aT.dataPtr(), aT.size(), rootId, localComm);
  }
}